

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDRefactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Dar_RefPar_t Pars;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Dar_ManDefaultRefParams(&Pars);
  Extra_UtilGetoptReset();
LAB_0022ea8d:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MKCelzvwh");
    iVar4 = globalUtilOptind;
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
LAB_0022eb74:
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022eb84:
        Abc_Print(-1,pcVar5);
        goto LAB_0022eb8e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nCutsMax = iVar1;
    }
    else if (iVar1 == 0x4b) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0022eb84;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nLeafMax = iVar1;
    }
    else {
      if (iVar1 != 0x4d) {
        piVar3 = &Pars.fExtend;
        if (((iVar1 != 0x65) && (piVar3 = &Pars.fUpdateLevel, iVar1 != 0x6c)) &&
           (piVar3 = &Pars.fVerbose, iVar1 != 0x76)) {
          if (iVar1 == 0x77) {
            piVar3 = &Pars.fVeryVerbose;
          }
          else {
            piVar3 = &Pars.fUseZeros;
            if (iVar1 != 0x7a) {
              if (iVar1 == -1) {
                if (pAVar2 == (Abc_Ntk_t *)0x0) {
                  pcVar5 = "Empty network.\n";
                }
                else if (pAVar2->ntkType == ABC_NTK_STRASH) {
                  if (0xfffffff3 < Pars.nLeafMax - 0x10U) {
                    pAVar2 = Abc_NtkDRefactor(pAVar2,&Pars);
                    if (pAVar2 != (Abc_Ntk_t *)0x0) {
                      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
                      return 0;
                    }
                    Abc_Print(-1,"Command has failed.\n");
                    return 0;
                  }
                  pcVar5 = "This command only works for cut sizes 4 <= K <= 15.\n";
                }
                else {
                  pcVar5 = "This command works only for strashed networks.\n";
                }
                iVar4 = -1;
                goto LAB_0022ec90;
              }
              goto LAB_0022eb8e;
            }
          }
        }
        *(byte *)piVar3 = (byte)*piVar3 ^ 1;
        goto LAB_0022ea8d;
      }
      if (argc <= globalUtilOptind) goto LAB_0022eb74;
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nMffcMin = iVar1;
    }
    globalUtilOptind = iVar4 + 1;
    if (iVar1 < 0) {
LAB_0022eb8e:
      iVar4 = -2;
      Abc_Print(-2,"usage: drf [-M num] [-K num] [-C num] [-elzvwh]\n");
      Abc_Print(-2,"\t         performs combinational AIG refactoring\n");
      Abc_Print(-2,"\t-M num : the min MFFC size to attempt refactoring [default = %d]\n",
                (ulong)(uint)Pars.nMffcMin);
      Abc_Print(-2,"\t-K num : the max number of cuts leaves [default = %d]\n",
                (ulong)(uint)Pars.nLeafMax);
      Abc_Print(-2,"\t-C num : the max number of cuts to try at a node [default = %d]\n",
                (ulong)(uint)Pars.nCutsMax);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (Pars.fExtend == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle extending tbe cut below MFFC [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fUpdateLevel == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle preserving the number of levels [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fUseZeros == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle using zero-cost replacements [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar5);
      if (Pars.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle very verbose printout [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_0022ec90:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDRefactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Dar_RefPar_t Pars, * pPars = &Pars;
    int c;

    extern Abc_Ntk_t * Abc_NtkDRefactor( Abc_Ntk_t * pNtk, Dar_RefPar_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Dar_ManDefaultRefParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MKCelzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMffcMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMffcMin < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLeafMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLeafMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'e':
            pPars->fExtend ^= 1;
            break;
        case 'l':
            pPars->fUpdateLevel ^= 1;
            break;
        case 'z':
            pPars->fUseZeros ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    if ( pPars->nLeafMax < 4 || pPars->nLeafMax > 15 )
    {
        Abc_Print( -1, "This command only works for cut sizes 4 <= K <= 15.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDRefactor( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: drf [-M num] [-K num] [-C num] [-elzvwh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG refactoring\n" );
    Abc_Print( -2, "\t-M num : the min MFFC size to attempt refactoring [default = %d]\n", pPars->nMffcMin );
    Abc_Print( -2, "\t-K num : the max number of cuts leaves [default = %d]\n", pPars->nLeafMax );
    Abc_Print( -2, "\t-C num : the max number of cuts to try at a node [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-e     : toggle extending tbe cut below MFFC [default = %s]\n", pPars->fExtend? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", pPars->fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle using zero-cost replacements [default = %s]\n", pPars->fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle very verbose printout [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}